

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

void ft_gzip_stream_close(FT_Stream stream)

{
  FT_GZipFile zip;
  FT_Memory memory;
  
  zip = (FT_GZipFile)(stream->descriptor).pointer;
  memory = stream->memory;
  if (zip != (FT_GZipFile)0x0) {
    ft_gzip_file_done(zip);
    ft_mem_free(memory,zip);
    (stream->descriptor).value = 0;
  }
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    ft_mem_free(memory,stream->base);
    stream->base = (uchar *)0x0;
  }
  return;
}

Assistant:

static void
  ft_gzip_stream_close( FT_Stream  stream )
  {
    FT_GZipFile  zip    = (FT_GZipFile)stream->descriptor.pointer;
    FT_Memory    memory = stream->memory;


    if ( zip )
    {
      /* finalize gzip file descriptor */
      ft_gzip_file_done( zip );

      FT_FREE( zip );

      stream->descriptor.pointer = NULL;
    }

    if ( !stream->read )
      FT_FREE( stream->base );
  }